

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_phase_spectrum.cc
# Opt level: O0

bool __thiscall
sptk::FilterCoefficientsToPhaseSpectrum::Run
          (FilterCoefficientsToPhaseSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *phase_spectrum,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  Buffer *in_RDI;
  long in_R8;
  double dVar9;
  double diff;
  int i;
  double offset;
  double inverse_pi;
  double *yi;
  double *xi;
  double *yr;
  double *xr;
  double *output;
  int output_length;
  int denominator_length;
  int numerator_length;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff08;
  double dVar11;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff18;
  bool local_1;
  
  iVar2 = *(int *)&(in_RDI->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  iVar10 = *(int *)((long)&(in_RDI->real_part_input_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + 4);
  if ((((((ulong)in_RDI[2].real_part_input_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish & 1) == 0) ||
       (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar3 != (long)(iVar2 + 1))) ||
      (sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDX),
      sVar3 != (long)(iVar10 + 1))) ||
     ((in_RCX == (vector<double,_std::allocator<double>_> *)0x0 || (in_R8 == 0)))) {
    local_1 = false;
  }
  else {
    iVar2 = *(int *)&(in_RDI->real_part_input_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish / 2 + 1;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RCX);
    if (sVar3 != (long)iVar2) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x40));
    if (sVar3 != (long)*(int *)&(in_RDI->real_part_input_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58));
    if (sVar3 != (long)*(int *)&(in_RDI->real_part_input_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff10._M_current,
                 (size_type)in_stack_ffffffffffffff08._M_current);
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffee8);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffee8);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffef8._M_current,(difference_type)in_RDI);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffee8);
    __first._M_current._4_4_ = in_stack_ffffffffffffff04;
    __first._M_current._0_4_ = in_stack_ffffffffffffff00;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first,in_stack_fffffffffffffef8,(double *)in_RDI);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffee8);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffee8);
    std::
    copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffee8);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffef8._M_current,(difference_type)in_RDI);
    std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffee8);
    __first_00._M_current._4_4_ = in_stack_ffffffffffffff04;
    __first_00._M_current._0_4_ = in_stack_ffffffffffffff00;
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (__first_00,in_stack_fffffffffffffef8,(double *)in_RDI);
    bVar1 = RealValuedFastFourierTransform::Run
                      ((RealValuedFastFourierTransform *)in_stack_ffffffffffffff08._M_current,
                       (vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffef8._M_current,in_RDI);
    if (bVar1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58),0);
      *pvVar4 = 1.0;
      bVar1 = RealValuedFastFourierTransform::Run
                        ((RealValuedFastFourierTransform *)in_stack_ffffffffffffff08._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffef8._M_current,in_RDI);
      if (bVar1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,0);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x40),0);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x58),0);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x70),0);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_R8 + 0x88),0);
        dVar11 = 0.0;
        for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 1) {
          dVar9 = atan2(pvVar7[iVar10] * pvVar6[iVar10] + -(pvVar5[iVar10] * pvVar8[iVar10]),
                        pvVar5[iVar10] * pvVar6[iVar10] + pvVar7[iVar10] * pvVar8[iVar10]);
          pvVar4[iVar10] = dVar9 * 0.3183098861837907;
          if ((((ulong)(in_RDI->real_part_input_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish & 0x100000000) != 0) && (0 < iVar10)) {
            dVar9 = (pvVar4[iVar10] - pvVar4[iVar10 + -1]) + dVar11;
            if (dVar9 <= 1.0) {
              if (1.0 < -dVar9) {
                dVar11 = dVar11 + 2.0;
              }
            }
            else {
              dVar11 = dVar11 - 2.0;
            }
            pvVar4[iVar10] = dVar11 + pvVar4[iVar10];
          }
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool FilterCoefficientsToPhaseSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* phase_spectrum,
    FilterCoefficientsToPhaseSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == phase_spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (phase_spectrum->size() != static_cast<std::size_t>(output_length)) {
    phase_spectrum->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }

  std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
            buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + numerator_length,
            buffer->real_part1_.end(), 0.0);
  std::copy(denominator_coefficients.begin(), denominator_coefficients.end(),
            buffer->real_part2_.begin());
  std::fill(buffer->real_part2_.begin() + denominator_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  buffer->real_part2_[0] = 1.0;
  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*phase_spectrum)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  const double inverse_pi(1.0 / sptk::kPi);
  double offset(0.0);

  for (int i(0); i < output_length; ++i) {
    output[i] = inverse_pi * std::atan2(xi[i] * yr[i] - xr[i] * yi[i],
                                        xr[i] * yr[i] + xi[i] * yi[i]);
    if (unwrapping_ && 0 < i) {
      const double diff(output[i] - output[i - 1] + offset);
      if (1.0 < diff) {
        offset -= 2.0;
      } else if (1.0 < -diff) {
        offset += 2.0;
      }
      output[i] += offset;
    }
  }

  return true;
}